

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

void __thiscall duckdb::JoinHashTable::SharedState::SharedState(SharedState *this)

{
  LogicalType LStack_48;
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,POINTER);
  Vector::Vector(&this->rhs_row_locations,&local_30,0x800);
  LogicalType::~LogicalType(&local_30);
  LogicalType::LogicalType(&LStack_48,UBIGINT);
  Vector::Vector(&this->salt_v,&LStack_48,0x800);
  LogicalType::~LogicalType(&LStack_48);
  SelectionVector::SelectionVector(&this->salt_match_sel,0x800);
  SelectionVector::SelectionVector(&this->key_no_match_sel,0x800);
  return;
}

Assistant:

JoinHashTable::SharedState::SharedState()
    : rhs_row_locations(LogicalType::POINTER), salt_v(LogicalType::UBIGINT), salt_match_sel(STANDARD_VECTOR_SIZE),
      key_no_match_sel(STANDARD_VECTOR_SIZE) {
}